

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableref.hpp
# Opt level: O2

void __thiscall duckdb::TableRef::~TableRef(TableRef *this)

{
  this->_vptr_TableRef = (_func_int **)&PTR__TableRef_0278a838;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->column_name_alias);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->external_dependency).internal.
              super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  ::std::unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::~unique_ptr
            (&(this->sample).
              super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>);
  ::std::__cxx11::string::~string((string *)&this->alias);
  return;
}

Assistant:

virtual ~TableRef() {
	}